

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall google::protobuf::compiler::Parser::ParseSyntaxIdentifier(Parser *this)

{
  bool bVar1;
  bool bVar2;
  string syntax;
  Token syntax_token;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_50 [40];
  int local_28;
  int local_24;
  
  bVar1 = Consume(this,"syntax","File must begin with \'syntax = \"proto2\";\'.");
  if ((!bVar1) || (bVar1 = Consume(this,"="), !bVar1)) {
    return false;
  }
  io::Tokenizer::Token::Token((Token *)local_50,&this->input_->current_);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  local_b0._M_string_length = 0;
  local_b0.field_2._M_local_buf[0] = '\0';
  bVar1 = ConsumeString(this,&local_b0,"Expected syntax identifier.");
  if ((bVar1) && (bVar1 = ConsumeEndOfDeclaration(this,";",(LocationRecorder *)0x0), bVar1)) {
    std::__cxx11::string::_M_assign((string *)&this->syntax_identifier_);
    bVar1 = std::operator!=(&local_b0,"proto2");
    bVar2 = true;
    if ((!bVar1) || (this->stop_after_syntax_identifier_ != false)) goto LAB_0021725a;
    std::operator+(&local_90,"Unrecognized syntax identifier \"",&local_b0);
    std::operator+(&local_70,&local_90,"\".  This parser only recognizes \"proto2\".");
    AddError(this,local_28,local_24,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
  }
  bVar2 = false;
LAB_0021725a:
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)(local_50 + 8));
  return bVar2;
}

Assistant:

bool Parser::ParseSyntaxIdentifier() {
  DO(Consume("syntax", "File must begin with 'syntax = \"proto2\";'."));
  DO(Consume("="));
  io::Tokenizer::Token syntax_token = input_->current();
  string syntax;
  DO(ConsumeString(&syntax, "Expected syntax identifier."));
  DO(ConsumeEndOfDeclaration(";", NULL));

  syntax_identifier_ = syntax;

  if (syntax != "proto2" && !stop_after_syntax_identifier_) {
    AddError(syntax_token.line, syntax_token.column,
      "Unrecognized syntax identifier \"" + syntax + "\".  This parser "
      "only recognizes \"proto2\".");
    return false;
  }

  return true;
}